

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphGenerator.cpp
# Opt level: O3

void __thiscall GraphGenerator::output(GraphGenerator *this,int n)

{
  FILE *__stream;
  pointer ppVar1;
  ulong uVar2;
  
  __stream = fopen((this->fileName)._M_dataplus._M_p,"w");
  fprintf(__stream,"p edge %d %d\n",n,
          (ulong)((long)(this->edges).
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->edges).
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 3);
  ppVar1 = (this->edges).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->edges).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppVar1) {
    uVar2 = 0;
    do {
      fprintf(__stream,"e %d %d\n",(ulong)(ppVar1[uVar2].first + 1),
              (ulong)(ppVar1[uVar2].second + 1));
      uVar2 = uVar2 + 1;
      ppVar1 = (this->edges).
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->edges).
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 3));
  }
  fclose(__stream);
  return;
}

Assistant:

void GraphGenerator::output(int n) {
	FILE *out = fopen(fileName.c_str(), "w");
	fprintf(out, "p edge %d %d\n", n, (int)edges.size());
	for (int i = 0; i < edges.size(); i++) {
		fprintf(out, "e %d %d\n", edges[i].first + 1, edges[i].second + 1);
	}
	fclose(out);
}